

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          BeliefSetNonStationary *Beliefs,ValueFunctionPOMDPDiscrete *V)

{
  pointer pdVar1;
  size_t __n;
  const_reference Beliefs_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  vector<double,_std::allocator<double>_> valuesT;
  
  __n = BeliefSetNonStationary::Size(Beliefs);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&valuesT);
  iVar2 = 0;
  uVar4 = 0;
  while( true ) {
    if (((long)(Beliefs->_m_beliefSets).
               super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(Beliefs->_m_beliefSets).
              super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18 == (ulong)uVar4) break;
    Beliefs_00 = std::
                 vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                 ::at(&Beliefs->_m_beliefSets,(ulong)uVar4);
    GetValues(&valuesT,Beliefs_00,V);
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar3 = 0;
        (long)valuesT.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)valuesT.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != (ulong)uVar3; uVar3 = uVar3 + 1) {
      pdVar1[uVar3 + iVar2] =
           valuesT.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&valuesT);
    uVar4 = uVar4 + 1;
    iVar2 = iVar2 + uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSetNonStationary &Beliefs,
                                      const ValueFunctionPOMDPDiscrete &V)
{
    vector<double> values(Beliefs.Size());
    Index i=0;
    for(Index t=0;t!=Beliefs.GetNumberOfTimeSteps();++t)
    {
        vector<double> valuesT=GetValues(Beliefs.Get(t),V);
        for(Index k=0;k!=valuesT.size();++k)
        {
            values[i]=valuesT[k];
            i++;
        }
    }
    return(values);
}